

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O1

bool CoreML::Specification::operator==(Imputer *a,Imputer *b)

{
  uint32 uVar1;
  uint32 uVar2;
  void *__n;
  Int64ToDoubleMap *a_00;
  Int64Vector *a_01;
  StringToDoubleMap *a_02;
  size_t __n_00;
  bool bVar3;
  int iVar4;
  DoubleVector *pDVar5;
  DoubleVector *pDVar6;
  Int64ToDoubleMap *b_00;
  Int64Vector *b_01;
  StringToDoubleMap *b_02;
  undefined8 *puVar7;
  int64 iVar8;
  int64 iVar9;
  undefined8 *puVar10;
  double dVar11;
  double dVar12;
  
  uVar1 = a->_oneof_case_[0];
  uVar2 = b->_oneof_case_[0];
  if (uVar1 != uVar2) {
    return false;
  }
  switch(uVar1) {
  case 0:
    goto switchD_002f67fc_caseD_0;
  case 1:
    dVar11 = 0.0;
    if (uVar1 == 1) {
      dVar12 = (a->ImputedValue_).imputeddoublevalue_;
    }
    else {
      dVar12 = 0.0;
    }
    if (uVar2 == 1) {
      dVar11 = (b->ImputedValue_).imputeddoublevalue_;
    }
    if ((dVar12 == dVar11) && (!NAN(dVar12) && !NAN(dVar11))) break;
    goto LAB_002f6a0e;
  case 2:
    iVar8 = 0;
    iVar9 = 0;
    if (uVar1 == 2) {
      iVar9 = (a->ImputedValue_).imputedint64value_;
    }
    if (uVar2 == 2) {
      iVar8 = (b->ImputedValue_).imputedint64value_;
    }
    if (iVar9 != iVar8) {
      return false;
    }
    break;
  case 3:
    pDVar6 = (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    pDVar5 = (DoubleVector *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    if (uVar1 == 3) {
      pDVar5 = (a->ImputedValue_).imputeddoublearray_;
    }
    if (uVar2 == 3) {
      pDVar6 = (b->ImputedValue_).imputeddoublearray_;
    }
    __n = (pDVar5->_internal_metadata_).
          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
          .ptr_;
    if ((__n != (pDVar6->_internal_metadata_).
                super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                .ptr_) ||
       ((__n != (void *)0x0 &&
        (iVar4 = bcmp((pDVar5->super_MessageLite)._vptr_MessageLite,
                      (pDVar6->super_MessageLite)._vptr_MessageLite,(size_t)__n), iVar4 != 0))))
    goto LAB_002f6a0e;
    break;
  case 4:
    pDVar5 = (a->ImputedValue_).imputeddoublearray_;
    if (b->_oneof_case_[0] == 4) {
      pDVar6 = (b->ImputedValue_).imputeddoublearray_;
    }
    else {
      pDVar6 = DoubleVector::default_instance();
    }
    bVar3 = vectorsEqual<CoreML::Specification::DoubleVector>(pDVar5,pDVar6);
    goto LAB_002f6931;
  case 5:
    a_01 = (a->ImputedValue_).imputedint64array_;
    if (b->_oneof_case_[0] == 5) {
      b_01 = (b->ImputedValue_).imputedint64array_;
    }
    else {
      b_01 = Int64Vector::default_instance();
    }
    bVar3 = vectorsEqual<CoreML::Specification::Int64Vector>(a_01,b_01);
    goto LAB_002f6931;
  case 6:
    a_02 = (a->ImputedValue_).imputedstringdictionary_;
    if (b->_oneof_case_[0] == 6) {
      b_02 = (b->ImputedValue_).imputedstringdictionary_;
    }
    else {
      b_02 = StringToDoubleMap::default_instance();
    }
    bVar3 = mapsEqual<CoreML::Specification::StringToDoubleMap>(a_02,b_02);
    if (!bVar3) goto LAB_002f6a0e;
    goto switchD_002f67fc_caseD_0;
  case 7:
    a_00 = (a->ImputedValue_).imputedint64dictionary_;
    if (b->_oneof_case_[0] == 7) {
      b_00 = (b->ImputedValue_).imputedint64dictionary_;
    }
    else {
      b_00 = Int64ToDoubleMap::default_instance();
    }
    bVar3 = mapsEqual<CoreML::Specification::Int64ToDoubleMap>(a_00,b_00);
LAB_002f6931:
    if (bVar3 != false) break;
    goto LAB_002f6a0e;
  }
  uVar1 = a->_oneof_case_[1];
  uVar2 = b->_oneof_case_[1];
  if (uVar1 == uVar2) {
    if (uVar1 == 0xd) {
LAB_002f69aa:
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      puVar7 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if (uVar1 == 0xd) {
        puVar7 = (undefined8 *)(a->ReplaceValue_).replaceint64value_;
      }
      if (uVar2 == 0xd) {
        puVar10 = (undefined8 *)(b->ReplaceValue_).replaceint64value_;
      }
      __n_00 = puVar7[1];
      if ((__n_00 != puVar10[1]) ||
         ((__n_00 != 0 && (iVar4 = bcmp((void *)*puVar7,(void *)*puVar10,__n_00), iVar4 != 0))))
      goto LAB_002f6a0e;
    }
    else {
      if (uVar1 == 0xc) {
        iVar9 = 0;
        if (uVar2 == 0xc) {
          iVar9 = (b->ReplaceValue_).replaceint64value_;
        }
        if ((a->ReplaceValue_).replaceint64value_ != iVar9) {
          return false;
        }
        goto LAB_002f69aa;
      }
      if (uVar1 == 0xb) {
        if (uVar1 == 0xb) {
          dVar11 = (a->ReplaceValue_).replacedoublevalue_;
        }
        else {
          dVar11 = 0.0;
        }
        if (((!NAN(dVar11)) || (uVar2 != 0xb)) || (!NAN((b->ReplaceValue_).replacedoublevalue_))) {
          if (uVar2 == 0xb) {
            dVar12 = (b->ReplaceValue_).replacedoublevalue_;
          }
          else {
            dVar12 = 0.0;
          }
          if ((dVar11 != dVar12) || (NAN(dVar11) || NAN(dVar12))) goto LAB_002f6a0e;
        }
      }
    }
switchD_002f67fc_caseD_0:
    bVar3 = true;
  }
  else {
LAB_002f6a0e:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline Imputer::ImputedValueCase Imputer::ImputedValue_case() const {
  return Imputer::ImputedValueCase(_oneof_case_[0]);
}